

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorTorque::IntLoadResidual_F
          (ChShaftsMotorTorque *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  int iVar4;
  Scalar *pSVar5;
  undefined4 in_register_00000034;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  peVar3 = (this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar6 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*peVar3->_vptr_ChFunction[4])(peVar3,CONCAT44(in_register_00000034,off));
  iVar4 = (*(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->super_ChPhysicsItem).
            super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->
                               super_ChPhysicsItem).offset_w);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *pSVar5;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = c;
    auVar1 = vfmadd231sd_fma(auVar7,auVar9,auVar1);
    *pSVar5 = auVar1._0_8_;
  }
  iVar4 = (*(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->super_ChPhysicsItem).
            super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->
                               super_ChPhysicsItem).offset_w);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = c;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar5;
    auVar1 = vfnmadd213sd_fma(auVar8,auVar10,auVar2);
    *pSVar5 = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChShaftsMotorTorque::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                const double c           // a scaling factor
                                ) {
    double imposed_torque = this->f_torque->Get_y(this->GetChTime());
    if (shaft1->IsActive())
        R(shaft1->GetOffset_w()) +=  imposed_torque * c;
    if (shaft2->IsActive())
        R(shaft2->GetOffset_w()) += -imposed_torque * c;
}